

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O3

int PictureARGBToYUVA(WebPPicture *picture,WebPEncCSP colorspace,float dithering,
                     int use_iterative_conversion)

{
  uint32_t *b_ptr;
  int iVar1;
  
  if (picture == (WebPPicture *)0x0) {
    return 0;
  }
  b_ptr = picture->argb;
  if (b_ptr != (uint32_t *)0x0) {
    if ((colorspace & WEBP_CSP_UV_MASK) != WEBP_YUV420) {
      iVar1 = WebPEncodingSetError(picture,VP8_ENC_ERROR_INVALID_CONFIGURATION);
      return iVar1;
    }
    picture->colorspace = WEBP_YUV420;
    iVar1 = ImportYUVAFromRGBA((uint8_t *)((long)b_ptr + 2),(uint8_t *)((long)b_ptr + 1),
                               (uint8_t *)b_ptr,(uint8_t *)((long)b_ptr + 3),4,
                               picture->argb_stride << 2,dithering,use_iterative_conversion,picture)
    ;
    return iVar1;
  }
  iVar1 = WebPEncodingSetError(picture,VP8_ENC_ERROR_NULL_PARAMETER);
  return iVar1;
}

Assistant:

static int PictureARGBToYUVA(WebPPicture* picture, WebPEncCSP colorspace,
                             float dithering, int use_iterative_conversion) {
  if (picture == NULL) return 0;
  if (picture->argb == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  } else if ((colorspace & WEBP_CSP_UV_MASK) != WEBP_YUV420) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  } else {
    const uint8_t* const argb = (const uint8_t*)picture->argb;
    const uint8_t* const a = argb + CHANNEL_OFFSET(0);
    const uint8_t* const r = argb + CHANNEL_OFFSET(1);
    const uint8_t* const g = argb + CHANNEL_OFFSET(2);
    const uint8_t* const b = argb + CHANNEL_OFFSET(3);

    picture->colorspace = WEBP_YUV420;
    return ImportYUVAFromRGBA(r, g, b, a, 4, 4 * picture->argb_stride,
                              dithering, use_iterative_conversion, picture);
  }
}